

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# swapimpl.cpp
# Opt level: O2

int32_t ucase_swap(UDataSwapper *ds,void *inData,int32_t length,void *outData,UErrorCode *pErrorCode
                  )

{
  void *__src;
  byte bVar1;
  int32_t iVar2;
  int32_t iVar3;
  void *__dest;
  char *fmt;
  long lVar4;
  int32_t indexes [16];
  int local_78 [18];
  
  iVar2 = udata_swapDataHeader_63(ds,inData,length,outData,pErrorCode);
  if (pErrorCode == (UErrorCode *)0x0) {
    return 0;
  }
  if (U_ZERO_ERROR < *pErrorCode) {
    return 0;
  }
  bVar1 = *(byte *)((long)inData + 0xd);
  if (((bVar1 != 0x41 || *(byte *)((long)inData + 0xc) != 99) ||
      (bVar1 = 0x41, *(char *)((long)inData + 0xe) != 'S')) ||
     (*(char *)((long)inData + 0xf) != 'E')) {
LAB_001f6e30:
    udata_printError_63(ds,
                        "ucase_swap(): data format %02x.%02x.%02x.%02x (format version %02x) is not recognized as case mapping data\n"
                        ,(ulong)*(byte *)((long)inData + 0xc),(ulong)bVar1,
                        (ulong)*(byte *)((long)inData + 0xe),(ulong)*(byte *)((long)inData + 0xf),
                        (uint)*(byte *)((long)inData + 0x10));
    *pErrorCode = U_UNSUPPORTED_ERROR;
    return 0;
  }
  if (*(char *)((long)inData + 0x10) == '\x01') {
    if ((*(char *)((long)inData + 0x12) != '\x05') || (*(char *)((long)inData + 0x13) != '\x02'))
    goto LAB_001f6e30;
  }
  else if (3 < (byte)(*(char *)((long)inData + 0x10) - 1U)) goto LAB_001f6e30;
  if ((-1 < length) && (length = length - iVar2, length < 0x40)) {
    fmt = "ucase_swap(): too few bytes (%d after header) for case mapping data\n";
LAB_001f6efc:
    udata_printError_63(ds,fmt,(ulong)(uint)length);
    *pErrorCode = U_INDEX_OUTOFBOUNDS_ERROR;
    return 0;
  }
  __src = (void *)((long)inData + (long)iVar2);
  __dest = (void *)((long)iVar2 + (long)outData);
  for (lVar4 = 0; lVar4 != 0x10; lVar4 = lVar4 + 1) {
    iVar3 = udata_readInt32_63(ds,*(int32_t *)((long)__src + lVar4 * 4));
    local_78[lVar4] = iVar3;
  }
  if (-1 < length) {
    if (length < local_78[1]) {
      fmt = "ucase_swap(): too few bytes (%d after header) for all of case mapping data\n";
      goto LAB_001f6efc;
    }
    if (inData != outData) {
      memcpy(__dest,__src,(long)local_78[1]);
    }
    (*ds->swapArray32)(ds,__src,local_78[0] * 4,__dest,pErrorCode);
    utrie_swapAnyVersion_63
              (ds,(void *)((long)__src + (long)local_78[0] * 4),local_78[2],
               (void *)((long)__dest + (long)local_78[0] * 4),pErrorCode);
    lVar4 = (long)(local_78[2] + local_78[0] * 4);
    (*ds->swapArray16)(ds,(void *)((long)__src + lVar4),(local_78[4] + local_78[3]) * 2,
                       (void *)((long)__dest + lVar4),pErrorCode);
  }
  return local_78[1] + iVar2;
}

Assistant:

static int32_t U_CALLCONV
ucase_swap(const UDataSwapper *ds,
           const void *inData, int32_t length, void *outData,
           UErrorCode *pErrorCode) {
    const UDataInfo *pInfo;
    int32_t headerSize;

    const uint8_t *inBytes;
    uint8_t *outBytes;

    const int32_t *inIndexes;
    int32_t indexes[16];

    int32_t i, offset, count, size;

    /* udata_swapDataHeader checks the arguments */
    headerSize=udata_swapDataHeader(ds, inData, length, outData, pErrorCode);
    if(pErrorCode==NULL || U_FAILURE(*pErrorCode)) {
        return 0;
    }

    /* check data format and format version */
    pInfo=(const UDataInfo *)((const char *)inData+4);
    if(!(
        pInfo->dataFormat[0]==UCASE_FMT_0 &&    /* dataFormat="cAsE" */
        pInfo->dataFormat[1]==UCASE_FMT_1 &&
        pInfo->dataFormat[2]==UCASE_FMT_2 &&
        pInfo->dataFormat[3]==UCASE_FMT_3 &&
        ((pInfo->formatVersion[0]==1 &&
          pInfo->formatVersion[2]==UTRIE_SHIFT &&
          pInfo->formatVersion[3]==UTRIE_INDEX_SHIFT) ||
         (2<=pInfo->formatVersion[0] && pInfo->formatVersion[0]<=4))
    )) {
        udata_printError(ds, "ucase_swap(): data format %02x.%02x.%02x.%02x (format version %02x) is not recognized as case mapping data\n",
                         pInfo->dataFormat[0], pInfo->dataFormat[1],
                         pInfo->dataFormat[2], pInfo->dataFormat[3],
                         pInfo->formatVersion[0]);
        *pErrorCode=U_UNSUPPORTED_ERROR;
        return 0;
    }

    inBytes=(const uint8_t *)inData+headerSize;
    outBytes=(uint8_t *)outData+headerSize;

    inIndexes=(const int32_t *)inBytes;

    if(length>=0) {
        length-=headerSize;
        if(length<16*4) {
            udata_printError(ds, "ucase_swap(): too few bytes (%d after header) for case mapping data\n",
                             length);
            *pErrorCode=U_INDEX_OUTOFBOUNDS_ERROR;
            return 0;
        }
    }

    /* read the first 16 indexes (ICU 3.2/format version 1: UCASE_IX_TOP==16, might grow) */
    for(i=0; i<16; ++i) {
        indexes[i]=udata_readInt32(ds, inIndexes[i]);
    }

    /* get the total length of the data */
    size=indexes[UCASE_IX_LENGTH];

    if(length>=0) {
        if(length<size) {
            udata_printError(ds, "ucase_swap(): too few bytes (%d after header) for all of case mapping data\n",
                             length);
            *pErrorCode=U_INDEX_OUTOFBOUNDS_ERROR;
            return 0;
        }

        /* copy the data for inaccessible bytes */
        if(inBytes!=outBytes) {
            uprv_memcpy(outBytes, inBytes, size);
        }

        offset=0;

        /* swap the int32_t indexes[] */
        count=indexes[UCASE_IX_INDEX_TOP]*4;
        ds->swapArray32(ds, inBytes, count, outBytes, pErrorCode);
        offset+=count;

        /* swap the UTrie */
        count=indexes[UCASE_IX_TRIE_SIZE];
        utrie_swapAnyVersion(ds, inBytes+offset, count, outBytes+offset, pErrorCode);
        offset+=count;

        /* swap the uint16_t exceptions[] and unfold[] */
        count=(indexes[UCASE_IX_EXC_LENGTH]+indexes[UCASE_IX_UNFOLD_LENGTH])*2;
        ds->swapArray16(ds, inBytes+offset, count, outBytes+offset, pErrorCode);
        offset+=count;

        U_ASSERT(offset==size);
    }

    return headerSize+size;
}